

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

int __thiscall
TPZBlockDiagonal<std::complex<float>_>::Substitution
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  long lVar1;
  long lVar2;
  complex<float> *buf;
  long lVar3;
  long col;
  long row;
  long rows;
  long lVar4;
  TPZFMatrix<std::complex<float>_> BTemp;
  
  if ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZBlockDiagonal<std::complex<float>>::Substitution(TPZFMatrix<TVar> *) const [TVar = std::complex<float>]"
               ,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
  }
  lVar3 = (this->fBlockSize).fNElements;
  lVar2 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  col = 0;
  if (lVar3 < 1) {
    lVar3 = col;
  }
  if (lVar2 < 1) {
    lVar2 = col;
  }
  for (; col != lVar2; col = col + 1) {
    row = 0;
    for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      rows = (long)(this->fBlockSize).fStore[lVar4];
      if (rows != 0) {
        lVar1 = (this->fBlockPos).fStore[lVar4];
        buf = TPZFMatrix<std::complex<float>_>::operator()(B,row,col);
        TPZFMatrix<std::complex<float>_>::TPZFMatrix(&BTemp,rows,1,buf,rows);
        TPZFMatrix<std::complex<float>_>::Substitution((this->fStorage).fStore + lVar1,rows,&BTemp);
        row = row + rows;
        TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&BTemp);
      }
    }
  }
  return 1;
}

Assistant:

int
TPZBlockDiagonal<TVar>::Substitution( TPZFMatrix<TVar> *B) const
{
	if(this->fDecomposed != ELU) {
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
	}
	
	int64_t b,nb,pos,bsize,eq=0;
	nb = fBlockSize.NElements();
	int64_t c, nc = B->Cols();
	for(c=0; c<nc; c++) {
		eq = 0;
		for(b=0;b<nb; b++) {
			pos = fBlockPos[b];
			bsize = fBlockSize[b];
			if(!bsize) continue;
			TPZFMatrix<TVar> BTemp(bsize,1,&(B->operator()(eq,c)),bsize);
			TVar *ptr = fStorage.begin()+pos;
			TPZFMatrix<TVar>::Substitution(ptr,bsize,&BTemp);
			eq+= bsize;
		}
	}
	return 1;
}